

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

void Vga_ManRollBack(Vta_Man_t *p,int nObjOld)

{
  int iVar1;
  Vta_Obj_t *pVVar2;
  int local_2c;
  int Entry;
  int i;
  Vta_Obj_t *pLimit;
  Vta_Obj_t *pThis;
  int nObjOld_local;
  Vta_Man_t *p_local;
  
  pVVar2 = p->pObjs;
  iVar1 = p->nObjs;
  for (pLimit = p->pObjs + nObjOld; pLimit < pVVar2 + iVar1; pLimit = pLimit + 1) {
    Vga_ManDelete(p,pLimit->iObj,pLimit->iFrame);
  }
  memset(p->pObjs + nObjOld,0,(long)(p->nObjs - nObjOld) << 4);
  p->nObjs = nObjOld;
  local_2c = 0;
  do {
    iVar1 = Vec_IntSize(p->vAddedNew);
    if (iVar1 <= local_2c) {
      return;
    }
    iVar1 = Vec_IntEntry(p->vAddedNew,local_2c);
    if (iVar1 < p->nObjs) {
      pVVar2 = Vta_ManObj(p,iVar1);
      if ((*(uint *)&pVVar2->field_0xc >> 0x1e & 1) != 1) {
        __assert_fail("pThis->fAdded == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                      ,0x558,"void Vga_ManRollBack(Vta_Man_t *, int)");
      }
      *(uint *)&pVVar2->field_0xc = *(uint *)&pVVar2->field_0xc & 0xbfffffff;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void Vga_ManRollBack( Vta_Man_t * p, int nObjOld )
{
    Vta_Obj_t * pThis  = p->pObjs + nObjOld;
    Vta_Obj_t * pLimit = p->pObjs + p->nObjs;
    int i, Entry;
    for ( ; pThis < pLimit; pThis++ )
        Vga_ManDelete( p, pThis->iObj, pThis->iFrame );
    memset( p->pObjs + nObjOld, 0, sizeof(Vta_Obj_t) * (p->nObjs - nObjOld) );
    p->nObjs = nObjOld;
    Vec_IntForEachEntry( p->vAddedNew, Entry, i )
        if ( Entry < p->nObjs )
        {
            pThis = Vta_ManObj(p, Entry);
            assert( pThis->fAdded == 1 );
            pThis->fAdded = 0;
        }
}